

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_BndryRegister.cpp
# Opt level: O2

void __thiscall
amrex::BndryRegister::define
          (BndryRegister *this,BoxArray *grids_,DistributionMapping *dmap,int in_rad,int out_rad,
          int extent_rad,int ncomp)

{
  Orientation _face;
  
  BoxArray::operator=(&this->grids,grids_);
  for (_face.val = 0; _face.val != 6; _face.val = _face.val + 1) {
    define(this,_face,(IndexType)0x0,in_rad,out_rad,extent_rad,ncomp,dmap);
  }
  return;
}

Assistant:

void
BndryRegister::define (const BoxArray& grids_,
                       const DistributionMapping& dmap,
                       int             in_rad,
                       int             out_rad,
                       int             extent_rad,
                       int             ncomp)
{
    grids = grids_;
    for (OrientationIter face; face; ++face)
    {
        define(face(),IndexType::TheCellType(),in_rad,out_rad,extent_rad,ncomp,dmap);
    }
}